

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O0

void routine(void *arg)

{
  FILE *__stream;
  int sock;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  int s;
  void *arg_local;
  
  sock = nn_socket(1,0x21);
  if ((-1 < sock) || (iVar1 = nn_errno(), iVar1 != 0x18)) {
    __stream = _stderr;
    if (sock < 0) {
      piVar2 = __errno_location();
      pcVar3 = nn_err_strerror(*piVar2);
      puVar4 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_shutdown.c"
              ,0x31);
      fflush(_stderr);
      nn_err_abort();
    }
    test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_shutdown.c"
                      ,0x32,sock,"ipc://test-shutdown.ipc");
    test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_shutdown.c"
                    ,0x33,sock);
  }
  return;
}

Assistant:

static void routine (NN_UNUSED void *arg)
{
    int s;

    s = nn_socket (AF_SP, NN_SUB);
    if (s < 0 && nn_errno () == EMFILE)
        return;
    errno_assert (s >= 0);
    test_connect (s, SOCKET_ADDRESS);
    test_close (s);
}